

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O0

int ctemplate_htmlparser::htmlparser_is_js_quoted(htmlparser_ctx *ctx)

{
  int iVar1;
  int st;
  htmlparser_ctx *ctx_local;
  
  iVar1 = htmlparser_in_js(ctx);
  if ((iVar1 == 0) || ((iVar1 = jsparser_state(ctx->jsparser), iVar1 != 1 && (iVar1 != 2)))) {
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

int htmlparser_is_js_quoted(htmlparser_ctx *ctx)
{
    if (htmlparser_in_js(ctx)) {
      int st = jsparser_state(ctx->jsparser);
      if (st == JSPARSER_STATE_Q ||
          st == JSPARSER_STATE_DQ)
        return 1;
    }
    return 0;
}